

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O0

ArrayIDIDFunc *
compute_tree_depth_order<main::__0>
          (ArrayIDIDFunc *tail,ArrayIDIDFunc *head,anon_class_8_1_f6d195b4 *compute_separator,
          int tree_depth_must_be_below)

{
  int iVar1;
  ArrayIDIDFunc *in_RDX;
  ArrayIDIDFunc *in_RSI;
  ArrayIDIDFunc *in_RDI;
  ArrayIDIDFunc to_input_id;
  int order_end;
  int arc_count;
  int node_count;
  ArrayIDIDFunc *order;
  ArrayIDIDFunc *this;
  int in_stack_ffffffffffffff3c;
  ArrayIDIDFunc *in_stack_ffffffffffffff40;
  ArrayIDIDFunc *in_stack_ffffffffffffff48;
  anon_class_32_4_cb35006c *in_stack_ffffffffffffff98;
  ArrayIDIDFunc *in_stack_ffffffffffffffa0;
  ArrayIDIDFunc *in_stack_ffffffffffffffa8;
  ArrayIDIDFunc *in_stack_ffffffffffffffb0;
  
  this = in_RDI;
  ArrayIDIDFunc::image_count(in_RSI);
  ArrayIDFunc<int>::preimage_count(&in_RSI->super_ArrayIDFunc<int>);
  ArrayIDIDFunc::ArrayIDIDFunc(this,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  identity_permutation(in_stack_ffffffffffffff3c);
  inplace_reorder_nodes_and_arc_in_preorder
            (head,(ArrayIDIDFunc *)compute_separator,
             (ArrayIDIDFunc *)CONCAT44(tree_depth_must_be_below,node_count));
  identity_permutation(in_stack_ffffffffffffff3c);
  forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,ArrayIDIDFunc,ArrayIDIDFunc,compute_tree_depth_order<main::__0>(ArrayIDIDFunc,ArrayIDIDFunc,main::__0_const&,int)::_lambda(ArrayIDIDFunc,ArrayIDIDFunc,ArrayIDIDFunc)_1_>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x150f06);
  iVar1 = ArrayIDFunc<int>::preimage_count(&in_RDI->super_ArrayIDFunc<int>);
  if (iVar1 != 0) {
    ArrayIDIDFunc::ArrayIDIDFunc(this,in_RDX);
    chain<ArrayIDIDFunc,ArrayIDIDFunc>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    ArrayIDIDFunc::operator=(this,in_RDX);
    ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x150f5c);
    ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x150f66);
  }
  ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x150fec);
  return this;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    (void)arc_count;

    ArrayIDIDFunc order(node_count, node_count);
    int order_end = 0;

    ArrayIDIDFunc to_input_id = identity_permutation(node_count);
    inplace_reorder_nodes_and_arc_in_preorder(tail, head, to_input_id);
    forall_connected_components_with_nodes_and_arcs_in_preorder(
        tail, head, identity_permutation(node_count),
        [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head,
            ArrayIDIDFunc sub_to_super) {
            int sub_node_count = sub_tail.image_count();
            ArrayIDIDFunc sub_order = compute_tree_depth_order_of_connected_graph(
                std::move(sub_tail), std::move(sub_head), compute_separator,
                tree_depth_must_be_below);
            if(sub_order.preimage_count() != 0){
                for (int i = 0; i < sub_node_count; ++i)
                    order[order_end++] = sub_to_super[sub_order[i]];
                return true;
            }else{
                order = ArrayIDIDFunc();
                return false;
            }
        });
    if(order.preimage_count() != 0){
        assert(order_end == node_count);
        order = chain(order, to_input_id);
    }
    return order;
}